

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<sdf_tools::Grid> * __thiscall
pybind11::class_<sdf_tools::Grid>::
def<std::vector<float,std::allocator<float>>const&(sdf_tools::Grid::*)()const,char[79]>
          (class_<sdf_tools::Grid> *this,char *name_,offset_in_Grid_to_subr *f,char (*extra) [79])

{
  offset_in_Grid_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_60;
  cpp_function local_58;
  object local_50;
  handle local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_48.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.class_.m_ptr = (handle)(handle)name_;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38 = local_60.m_ptr;
  cpp_function::
  cpp_function<std::vector<float,std::allocator<float>>const&,sdf_tools::Grid,,pybind11::name,pybind11::is_method,pybind11::sibling,char[79]>
            (&local_58,f_00,extra_00,&local_40,(sibling *)&local_48,(char (*) [79])&local_38);
  object::~object((object *)&local_60);
  object::~object(&local_50);
  detail::add_class_method((object *)this,name_,&local_58);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }